

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O0

CompileMessage * __thiscall
soul::CompileMessageHelpers::
createMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          CodeLocation *location,Type type,char *text,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar1;
  size_type sVar2;
  reference value;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  string *local_1a8;
  string local_170;
  string local_150;
  string local_130;
  ulong local_110;
  size_t i;
  string *local_100;
  string local_f8;
  string local_d8;
  string local_b8;
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  allocator<char> local_59;
  string local_58 [8];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *text_local;
  Type type_local;
  CodeLocation *location_local;
  Category category_local;
  
  result.field_2._8_8_ = text;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,(char *)CONCAT44(in_register_00000084,type),&local_59);
  std::allocator<char>::~allocator(&local_59);
  local_100 = &local_f8;
  convertToString(local_100,(string *)result.field_2._8_8_);
  local_100 = &local_d8;
  convertToString(local_100,args);
  local_100 = &local_b8;
  convertToString(local_100,args_1);
  local_98 = &local_f8;
  local_90 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&i + 7));
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&i + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&i + 7));
  local_1a8 = (string *)&local_98;
  do {
    local_1a8 = local_1a8 + -1;
    std::__cxx11::string::~string((string *)local_1a8);
  } while (local_1a8 != &local_f8);
  local_110 = 0;
  while( true ) {
    uVar1 = local_110;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
    if (sVar2 <= uVar1) break;
    std::__cxx11::string::string((string *)&local_150,local_58);
    uVar1 = local_110;
    value = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_88,local_110);
    replaceArgument(&local_130,&local_150,uVar1,value);
    std::__cxx11::string::operator=(local_58,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    local_110 = local_110 + 1;
  }
  std::__cxx11::string::string((string *)&local_170,local_58);
  choc::text::trim(&__return_storage_ptr__->description,&local_170);
  CodeLocation::CodeLocation
            (&__return_storage_ptr__->location,
             (CodeLocation *)CONCAT44(in_register_00000014,category));
  __return_storage_ptr__->type = (Type)location;
  __return_storage_ptr__->category = (Category)this;
  std::__cxx11::string::~string((string *)&local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CodeLocation location,
                                         CompileMessage::Type type, const char* text, Args&&... args)
    {
        std::string result (text);
        std::vector<std::string> stringArgs { convertToString (args)... };

        for (size_t i = 0; i < stringArgs.size(); ++i)
            result = replaceArgument (result, i, stringArgs[i]);

        return CompileMessage { choc::text::trim (result), location, type, category };
    }